

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O1

void __thiscall
OSTEIDeriv1_Writer::Write_Permute_(OSTEIDeriv1_Writer *this,QAM *am,bool swap12,bool swap34)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ostream *poVar9;
  size_t sVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  _Alloc_hider _Var12;
  char *__s;
  char *__s_00;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char vd;
  char vc;
  char vb;
  char va;
  string local_1d0;
  int local_1b0;
  undefined4 local_1ac;
  string local_1a8;
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  size_type local_170;
  undefined1 local_168 [16];
  string idx;
  size_t ncart_abcd;
  string fname;
  size_t ncart_cd;
  size_t ncart_bcd;
  size_t ncart_d;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_1ac = (undefined4)CONCAT71(in_register_00000009,swap34);
  local_188._0_8_ = *(undefined8 *)(am->qam)._M_elems;
  local_188._8_8_ = *(undefined8 *)((am->qam)._M_elems + 2);
  local_178._M_p = local_168;
  pcVar3 = (am->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar3,pcVar3 + (am->tag)._M_string_length);
  local_1b0 = (int)CONCAT71(in_register_00000011,swap12);
  if (local_1b0 != 0) {
    iVar13 = SUB84(local_188._0_8_,4);
    local_188._4_4_ = (int)local_188._0_8_;
    local_188._0_4_ = iVar13;
  }
  if ((byte)local_1ac != 0) {
    uVar7 = local_188._8_4_;
    uVar8 = local_188._12_4_;
    local_188._12_4_ = local_188._8_4_;
    local_188._8_4_ = uVar8;
    if (uVar8 == uVar7 && !swap12) goto LAB_00132bad;
  }
  if ((swap12 && (byte)local_1ac == 0) && (local_188._0_4_ == local_188._4_4_)) goto LAB_00132bad;
  if ((swap12 & (byte)local_1ac) == 1) {
    if (local_188._0_4_ == local_188._4_4_) goto LAB_00132bad;
    if (local_188._8_4_ == local_188._12_4_) goto LAB_00132bad;
  }
  poVar9 = (this->super_OSTEI_Writer_Base).os_;
  local_98._0_8_ = local_188._0_8_;
  local_98._8_8_ = local_188._8_8_;
  _Var12._M_p = local_178._M_p;
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_178._M_p,local_178._M_p + local_170);
  FunctionPrototype__abi_cxx11_(&fname,(OSTEIDeriv1_Writer *)_Var12._M_p,(QAM *)local_98);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,fname._M_dataplus._M_p,fname._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p);
  }
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"{\n",2);
  if ((char)local_1b0 == '\0') {
    __s = "P";
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"double P_AB[3*P.nshell12];\n",0x1b);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"struct simint_multi_shellpair P_tmp = P;\n",0x29);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"P_tmp.alpha2 = P.beta2;  P_tmp.beta2 = P.alpha2;\n",0x31);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n",0x41);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n",0x41);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"P_tmp.AB_x = P_AB;\n",0x13);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"P_tmp.AB_y = P_AB + P.nshell12;\n",0x20);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"P_tmp.AB_z = P_AB + 2*P.nshell12;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"for(int i = 0; i < P.nshell12; i++)\n",0x24);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"{\n",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                        indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"P_tmp.AB_x[i] = -P.AB_x[i];\n",0x1c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                        indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"P_tmp.AB_y[i] = -P.AB_y[i];\n",0x1c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                        indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"P_tmp.AB_z[i] = -P.AB_z[i];\n",0x1c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n\n",3);
    __s = "P_tmp";
  }
  if ((byte)local_1ac == '\0') {
    __s_00 = "Q";
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"double Q_AB[3*Q.nshell12];\n",0x1b);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"struct simint_multi_shellpair Q_tmp = Q;\n",0x29);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Q_tmp.alpha2 = Q.beta2;  Q_tmp.beta2 = Q.alpha2;\n",0x31);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n",0x41);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n",0x41);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Q_tmp.AB_x = Q_AB;\n",0x13);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Q_tmp.AB_y = Q_AB + Q.nshell12;\n",0x20);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"for(int i = 0; i < Q.nshell12; i++)\n",0x24);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"{\n",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                        indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Q_tmp.AB_x[i] = -Q.AB_x[i];\n",0x1c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                        indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Q_tmp.AB_y[i] = -Q.AB_y[i];\n",0x1c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                        indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Q_tmp.AB_z[i] = -Q.AB_z[i];\n",0x1c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                        indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n\n",3);
    __s_00 = "Q_tmp";
  }
  local_f8 = *(undefined8 *)(am->qam)._M_elems;
  uStack_f0 = *(undefined8 *)((am->qam)._M_elems + 2);
  pcVar3 = (am->tag)._M_dataplus._M_p;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar3,pcVar3 + (am->tag)._M_string_length);
  StringBuilder<char[14],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (&fname,(char (*) [14])"ostei_deriv1_",
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (int)local_f8,
             (char (*) [2])0x149cdb,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_f8._4_4_,
             (char (*) [2])0x149cdb,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (int)uStack_f0,
             (char (*) [2])0x149cdb,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + uStack_f0._4_4_);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"int ret = ",10);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,fname._M_dataplus._M_p,fname._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
  sVar10 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s,sVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  sVar10 = strlen(__s_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s_00,sVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", screen_tol, ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"work, ",6);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  ArrVarName(&idx,(QAM *)local_188,&local_1d0);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,idx._M_dataplus._M_p,idx._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)idx._M_dataplus._M_p != &idx.field_2) {
    operator_delete(idx._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  local_68 = *(undefined8 *)(am->qam)._M_elems;
  uStack_60 = *(undefined8 *)((am->qam)._M_elems + 2);
  pcVar3 = (am->tag)._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar3,pcVar3 + (am->tag)._M_string_length);
  auVar14._0_4_ = (int)local_68 + 2;
  auVar14._4_4_ = local_68._4_4_ + 2;
  auVar14._8_4_ = (int)uStack_60 + 2;
  auVar14._12_4_ = uStack_60._4_4_ + 2;
  auVar15._4_4_ = local_68._4_4_ + 1;
  auVar15._12_4_ = uStack_60._4_4_ + 1;
  auVar15._0_4_ = auVar15._4_4_;
  auVar15._8_4_ = auVar15._12_4_;
  ncart_abcd = ((ulong)(~((int)uStack_60 >> 0x1f) &
                       (uint)((auVar14._8_8_ & 0xffffffff) * (ulong)((int)uStack_60 + 1)) >> 1) *
                (ulong)(~((int)local_68 >> 0x1f) & (uint)(auVar14._0_4_ * ((int)local_68 + 1)) >> 1)
               & 0xffffffff) *
               ((ulong)(~(local_68._4_4_ >> 0x1f) & (uint)(auVar15._4_4_ * auVar14._4_4_) >> 1) *
                (ulong)(~(uStack_60._4_4_ >> 0x1f) &
                       (uint)((auVar15._8_8_ & 0xffffffff) * (ulong)auVar14._12_4_) >> 1) &
               0xffffffff) & 0xffffffff;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  iVar13 = (am->qam)._M_elems[1];
  iVar2 = (am->qam)._M_elems[2];
  uVar11 = 0;
  uVar4 = (uint)((iVar13 + 1) * (iVar13 + 2)) >> 1;
  if (iVar13 < 0) {
    uVar4 = uVar11;
  }
  uVar5 = (uint)((iVar2 + 1) * (iVar2 + 2)) >> 1;
  if (iVar2 < 0) {
    uVar5 = uVar11;
  }
  iVar13 = (am->qam)._M_elems[3];
  uVar6 = (uint)((iVar13 + 1) * (iVar13 + 2)) >> 1;
  if (iVar13 < 0) {
    uVar6 = uVar11;
  }
  ncart_d = (size_t)uVar6;
  ncart_cd = uVar5 * ncart_d;
  ncart_bcd = uVar4 * ncart_cd;
  va = 'a';
  vb = 'b';
  vc = 'c';
  vd = 'd';
  if ((char)local_1b0 != '\0') {
    va = 'b';
    vb = 'a';
  }
  if ((byte)local_1ac != '\0') {
    vc = 'd';
    vd = 'c';
  }
  StringBuilder<char[7],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (&idx,(char (*) [7])"12*(q*",&ncart_abcd,(char (*) [2])"+",&va,(char (*) [2])0x14cada,
             &ncart_bcd,(char (*) [2])"+",&vb,(char (*) [2])0x14cada,&ncart_cd,(char (*) [2])"+",&vc
             ,(char (*) [2])0x14cada,&ncart_d,(char (*) [2])"+",&vd,(char (*) [2])0x14998b);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"double buffer[12*",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] SIMINT_ALIGN_ARRAY_DBL;\n\n",0x1b);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"for(int q = 0; q < ret; q++)\n",0x1d);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"{\n",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                      indent2_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"int idx = 0;\n",0xd);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                      indent2_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"for(int a = 0; a < ",0x13);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; ++a)\n",7);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                      indent2_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"for(int b = 0; b < ",0x13);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; ++b)\n",7);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                      indent2_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"for(int c = 0; c < ",0x13);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; ++c)\n",7);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                      indent2_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"for(int d = 0; d < ",0x13);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; ++d)\n",7);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                      indent2_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"{\n",2);
  poVar9 = (this->super_OSTEI_Writer_Base).os_;
  if ((char)local_1b0 == '\0') {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,indent3_abi_cxx11_._M_dataplus._M_p,
                        indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"memcpy(buffer + idx + 0, ",0x19);
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    ArrVarName(&local_1d0,(QAM *)local_188,&local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + ",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,idx._M_dataplus._M_p,idx._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + 0, 6*sizeof(double));\n",0x19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_0013262b;
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,indent3_abi_cxx11_._M_dataplus._M_p,
                        indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"memcpy(buffer + idx + 0, ",0x19);
    paVar1 = &local_1a8.field_2;
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    ArrVarName(&local_1d0,(QAM *)local_188,&local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + ",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,idx._M_dataplus._M_p,idx._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + 3, 3*sizeof(double));\n",0x19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent3_abi_cxx11_._M_dataplus._M_p,
                        indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"memcpy(buffer + idx + 3, ",0x19);
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    ArrVarName(&local_1d0,(QAM *)local_188,&local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + ",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,idx._M_dataplus._M_p,idx._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + 0, 3*sizeof(double));\n",0x19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
LAB_0013262b:
      operator_delete(local_1a8._M_dataplus._M_p);
    }
  }
  poVar9 = (this->super_OSTEI_Writer_Base).os_;
  if ((byte)local_1ac == '\0') {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,indent3_abi_cxx11_._M_dataplus._M_p,
                        indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"memcpy(buffer + idx + 6, ",0x19);
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    ArrVarName(&local_1d0,(QAM *)local_188,&local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + ",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,idx._M_dataplus._M_p,idx._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + 6, 6*sizeof(double));\n",0x19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_001328b1;
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,indent3_abi_cxx11_._M_dataplus._M_p,
                        indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"memcpy(buffer + idx + 6, ",0x19);
    paVar1 = &local_1a8.field_2;
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    ArrVarName(&local_1d0,(QAM *)local_188,&local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + ",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,idx._M_dataplus._M_p,idx._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + 9, 3*sizeof(double));\n",0x19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((this->super_OSTEI_Writer_Base).os_,indent3_abi_cxx11_._M_dataplus._M_p,
                        indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"memcpy(buffer + idx + 9, ",0x19);
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    ArrVarName(&local_1d0,(QAM *)local_188,&local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + ",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,idx._M_dataplus._M_p,idx._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," + 6, 3*sizeof(double));\n",0x19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
LAB_001328b1:
      operator_delete(local_1a8._M_dataplus._M_p);
    }
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent3_abi_cxx11_._M_dataplus._M_p,
                      indent3_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"idx += 12;\n",0xb);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                      indent2_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                      indent2_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"memcpy(",7);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
  ArrVarName(&local_1d0,(QAM *)local_188,&local_1a8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"+q*12*",6);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", buffer, 12*",0xd);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"*sizeof(double));\n",0x12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                      indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ret;\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
  poVar9 = (this->super_OSTEI_Writer_Base).osh_;
  local_c8._0_8_ = local_188._0_8_;
  local_c8._8_8_ = local_188._8_8_;
  _Var12._M_p = local_178._M_p;
  local_b8._M_p = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_178._M_p,local_178._M_p + local_170);
  FunctionPrototype__abi_cxx11_(&local_1d0,(OSTEIDeriv1_Writer *)_Var12._M_p,(QAM *)local_c8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)idx._M_dataplus._M_p != &idx.field_2) {
    operator_delete(idx._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p);
  }
LAB_00132bad:
  if ((OSTEIDeriv1_Writer *)local_178._M_p != (OSTEIDeriv1_Writer *)local_168) {
    operator_delete(local_178._M_p);
  }
  return;
}

Assistant:

void OSTEIDeriv1_Writer::Write_Permute_(QAM am, bool swap12, bool swap34) const
{
    QAM permuted = am;
    if(swap12)
        std::swap(permuted[0], permuted[1]);
    if(swap34)
        std::swap(permuted[2], permuted[3]);

    // is this permutation unique?
    if(swap34 && !swap12 && permuted[2] == permuted[3])
        return;
    if(swap12 && !swap34 && permuted[0] == permuted[1])
        return;
    if(swap12 && swap34 && (permuted[0] == permuted[1] || permuted[2] == permuted[3]))
        return;

    // output of the function starts here
    os_ << FunctionPrototype_(permuted) << "\n";
    os_ << "{\n";

    const char * P_var = "P";
    const char * Q_var = "Q";

    if(swap12)
    {
        P_var = "P_tmp";
        os_ << indent1 << "double P_AB[3*P.nshell12];\n";
    	os_ << indent1 << "struct simint_multi_shellpair P_tmp = P;\n";
        os_ << indent1 << "P_tmp.alpha2 = P.beta2;  P_tmp.beta2 = P.alpha2;\n";
        os_ << indent1 << "P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n";
        os_ << indent1 << "P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n";
        os_ << indent1 << "P_tmp.AB_x = P_AB;\n";
        os_ << indent1 << "P_tmp.AB_y = P_AB + P.nshell12;\n";
        os_ << indent1 << "P_tmp.AB_z = P_AB + 2*P.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < P.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "P_tmp.AB_x[i] = -P.AB_x[i];\n";
        os_ << indent2 << "P_tmp.AB_y[i] = -P.AB_y[i];\n";
        os_ << indent2 << "P_tmp.AB_z[i] = -P.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    if(swap34)
    {
	    Q_var = "Q_tmp";
        os_ << indent1 << "double Q_AB[3*Q.nshell12];\n";
    	os_ << indent1 << "struct simint_multi_shellpair Q_tmp = Q;\n";
        os_ << indent1 << "Q_tmp.alpha2 = Q.beta2;  Q_tmp.beta2 = Q.alpha2;\n";
		os_ << indent1 << "Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n";
        os_ << indent1 << "Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n";
        os_ << indent1 << "Q_tmp.AB_x = Q_AB;\n";
        os_ << indent1 << "Q_tmp.AB_y = Q_AB + Q.nshell12;\n";
        os_ << indent1 << "Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < Q.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "Q_tmp.AB_x[i] = -Q.AB_x[i];\n";
        os_ << indent2 << "Q_tmp.AB_y[i] = -Q.AB_y[i];\n";
        os_ << indent2 << "Q_tmp.AB_z[i] = -Q.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    std::string fname = FunctionName_(am);
    os_ << indent1 << "int ret = " << fname
        << "(" << P_var << ", " << Q_var << ", screen_tol, "
        << "work, " << ArrVarName(permuted) << ");\n";


    size_t ncart_abcd = NCART(am);
    //size_t ncart_a  = NCART(am[0]);
    size_t ncart_b  = NCART(am[1]);
    size_t ncart_c  = NCART(am[2]);
    size_t ncart_d  = NCART(am[3]);
    size_t ncart_a2 = NCART(permuted[0]);
    size_t ncart_b2 = NCART(permuted[1]);
    size_t ncart_c2 = NCART(permuted[2]);
    size_t ncart_d2 = NCART(permuted[3]);

    size_t ncart_bcd = ncart_b * ncart_c * ncart_d;
    size_t ncart_cd = ncart_c * ncart_d;

    char va = 'a';
    char vb = 'b';
    char vc = 'c';
    char vd = 'd';

    if(swap12)
        std::swap(va, vb);
    if(swap34)
        std::swap(vc, vd);

    std::string idx = StringBuilder("12*(q*", ncart_abcd,
                                    "+", va, "*", ncart_bcd,
                                    "+", vb, "*", ncart_cd,
                                    "+", vc, "*", ncart_d, "+", vd, ")");

    os_ << indent1 << "double buffer[12*" << ncart_abcd << "] SIMINT_ALIGN_ARRAY_DBL;\n\n";


    os_ << indent1 << "for(int q = 0; q < ret; q++)\n";
    os_ << indent1 << "{\n";
    os_ << indent2 << "int idx = 0;\n";
    os_ << indent2 << "for(int a = 0; a < " << ncart_a2 << "; ++a)\n";
    os_ << indent2 << "for(int b = 0; b < " << ncart_b2 << "; ++b)\n";
    os_ << indent2 << "for(int c = 0; c < " << ncart_c2 << "; ++c)\n";
    os_ << indent2 << "for(int d = 0; d < " << ncart_d2 << "; ++d)\n";
    os_ << indent2 << "{\n";
    if(swap12)
    {
        os_ << indent3 << "memcpy(buffer + idx + 0, " << ArrVarName(permuted) << " + " << idx << " + 3, 3*sizeof(double));\n";
        os_ << indent3 << "memcpy(buffer + idx + 3, " << ArrVarName(permuted) << " + " << idx << " + 0, 3*sizeof(double));\n";
    }
    else
        os_ << indent3 << "memcpy(buffer + idx + 0, " << ArrVarName(permuted) << " + " << idx << " + 0, 6*sizeof(double));\n";

    if(swap34)
    {
        os_ << indent3 << "memcpy(buffer + idx + 6, " << ArrVarName(permuted) << " + " << idx << " + 9, 3*sizeof(double));\n";
        os_ << indent3 << "memcpy(buffer + idx + 9, " << ArrVarName(permuted) << " + " << idx << " + 6, 3*sizeof(double));\n";
    }
    else
        os_ << indent3 << "memcpy(buffer + idx + 6, " << ArrVarName(permuted) << " + " << idx << " + 6, 6*sizeof(double));\n";

    os_ << indent3 << "idx += 12;\n";
    os_ << indent2 << "}\n";
    os_ << "\n";
        os_ << indent2 << "memcpy(" << ArrVarName(permuted) << "+q*12*" << ncart_abcd
                       << ", buffer, 12*" << ncart_abcd << "*sizeof(double));\n";
    os_ << indent1 << "}\n";

    os_ << "\n";
    os_ << indent1 << "return ret;\n";
    os_ << "}\n";
    os_ << "\n";

    osh_ << FunctionPrototype_(permuted) << ";\n\n";
}